

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

xmlSaveCtxtPtr xmlNewSaveCtxt(char *encoding,int options)

{
  xmlParserErrors code;
  xmlSaveCtxtPtr ctxt;
  xmlChar *pxVar1;
  char *in_RCX;
  
  ctxt = (xmlSaveCtxtPtr)(*xmlMalloc)(0x78);
  if (ctxt == (xmlSaveCtxtPtr)0x0) {
    ctxt = (xmlSaveCtxtPtr)0x0;
    xmlSaveErrMemory((xmlOutputBufferPtr)0x0);
  }
  else {
    *(undefined8 *)(ctxt->indent + 0x3c) = 0;
    *(undefined8 *)&ctxt->indent_size = 0;
    ctxt->indent[0x2c] = '\0';
    ctxt->indent[0x2d] = '\0';
    ctxt->indent[0x2e] = '\0';
    ctxt->indent[0x2f] = '\0';
    ctxt->indent[0x30] = '\0';
    ctxt->indent[0x31] = '\0';
    ctxt->indent[0x32] = '\0';
    ctxt->indent[0x33] = '\0';
    ctxt->indent[0x34] = '\0';
    ctxt->indent[0x35] = '\0';
    ctxt->indent[0x36] = '\0';
    ctxt->indent[0x37] = '\0';
    ctxt->indent[0x38] = '\0';
    ctxt->indent[0x39] = '\0';
    ctxt->indent[0x3a] = '\0';
    ctxt->indent[0x3b] = '\0';
    ctxt->indent[0x1c] = '\0';
    ctxt->indent[0x1d] = '\0';
    ctxt->indent[0x1e] = '\0';
    ctxt->indent[0x1f] = '\0';
    ctxt->indent[0x20] = '\0';
    ctxt->indent[0x21] = '\0';
    ctxt->indent[0x22] = '\0';
    ctxt->indent[0x23] = '\0';
    ctxt->indent[0x24] = '\0';
    ctxt->indent[0x25] = '\0';
    ctxt->indent[0x26] = '\0';
    ctxt->indent[0x27] = '\0';
    ctxt->indent[0x28] = '\0';
    ctxt->indent[0x29] = '\0';
    ctxt->indent[0x2a] = '\0';
    ctxt->indent[0x2b] = '\0';
    ctxt->indent[0xc] = '\0';
    ctxt->indent[0xd] = '\0';
    ctxt->indent[0xe] = '\0';
    ctxt->indent[0xf] = '\0';
    ctxt->indent[0x10] = '\0';
    ctxt->indent[0x11] = '\0';
    ctxt->indent[0x12] = '\0';
    ctxt->indent[0x13] = '\0';
    ctxt->indent[0x14] = '\0';
    ctxt->indent[0x15] = '\0';
    ctxt->indent[0x16] = '\0';
    ctxt->indent[0x17] = '\0';
    ctxt->indent[0x18] = '\0';
    ctxt->indent[0x19] = '\0';
    ctxt->indent[0x1a] = '\0';
    ctxt->indent[0x1b] = '\0';
    ctxt->format = 0;
    ctxt->indent[0] = '\0';
    ctxt->indent[1] = '\0';
    ctxt->indent[2] = '\0';
    ctxt->indent[3] = '\0';
    ctxt->indent[4] = '\0';
    ctxt->indent[5] = '\0';
    ctxt->indent[6] = '\0';
    ctxt->indent[7] = '\0';
    ctxt->indent[8] = '\0';
    ctxt->indent[9] = '\0';
    ctxt->indent[10] = '\0';
    ctxt->indent[0xb] = '\0';
    ctxt->buf = (xmlOutputBufferPtr)0x0;
    ctxt->options = 0;
    ctxt->level = 0;
    ctxt->encoding = (xmlChar *)0x0;
    ctxt->handler = (xmlCharEncodingHandlerPtr)0x0;
    ctxt->escape = (xmlCharEncodingOutputFunc)0x0;
    if (encoding != (char *)0x0) {
      code = xmlOpenCharEncodingHandler(encoding,1,&ctxt->handler);
      if (code != XML_ERR_OK) {
        xmlSaveErr((xmlOutputBufferPtr)0x0,code,(xmlNodePtr)encoding,in_RCX);
        xmlFreeSaveCtxt(ctxt);
        return (xmlSaveCtxtPtr)0x0;
      }
      pxVar1 = xmlStrdup((xmlChar *)encoding);
      ctxt->encoding = pxVar1;
    }
    xmlSaveCtxtInit(ctxt,options);
  }
  return ctxt;
}

Assistant:

static xmlSaveCtxtPtr
xmlNewSaveCtxt(const char *encoding, int options)
{
    xmlSaveCtxtPtr ret;

    ret = (xmlSaveCtxtPtr) xmlMalloc(sizeof(xmlSaveCtxt));
    if (ret == NULL) {
	xmlSaveErrMemory(NULL);
	return ( NULL );
    }
    memset(ret, 0, sizeof(xmlSaveCtxt));

    if (encoding != NULL) {
        xmlParserErrors res;

        res = xmlOpenCharEncodingHandler(encoding, /* output */ 1,
                                         &ret->handler);
	if (res != XML_ERR_OK) {
	    xmlSaveErr(NULL, res, NULL, encoding);
            xmlFreeSaveCtxt(ret);
	    return(NULL);
	}
        ret->encoding = xmlStrdup((const xmlChar *)encoding);
    }

    xmlSaveCtxtInit(ret, options);

    return(ret);
}